

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

bool __thiscall
DisasmReplayer::enqueue_create_graphics_pipeline
          (DisasmReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  pointer *pppVVar1;
  pointer *pppVVar2;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  bool bVar3;
  VkResult VVar4;
  VkGraphicsPipelineCreateInfo *local_38;
  Hash local_30;
  
  local_38 = create_info;
  local_30 = hash;
  bVar3 = graphics_pipeline_is_active(this,hash);
  if (bVar3) {
    if (this->device == (VulkanDevice *)0x0) {
      *pipeline = (VkPipeline)hash;
    }
    else {
      if (this->device->pipeline_stats == true) {
        *(byte *)&create_info->flags = (byte)create_info->flags | 0xc0;
      }
      fprintf((FILE *)_stderr,"Fossilize INFO: Creating graphics pipeline %0lX\n",hash);
      fflush((FILE *)_stderr);
      VVar4 = (*vkCreateGraphicsPipelines)
                        (this->device->device,this->pipeline_cache,1,create_info,
                         (VkAllocationCallbacks *)0x0,pipeline);
      if (VVar4 != VK_SUCCESS) {
        enqueue_create_graphics_pipeline(_stderr);
        return false;
      }
      enqueue_create_graphics_pipeline(_stderr);
    }
    __position._M_current =
         (this->graphics_pipelines).
         super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->graphics_pipelines).
        super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkPipeline_T*,std::allocator<VkPipeline_T*>>::
      _M_realloc_insert<VkPipeline_T*const&>
                ((vector<VkPipeline_T*,std::allocator<VkPipeline_T*>> *)&this->graphics_pipelines,
                 __position,pipeline);
    }
    else {
      *__position._M_current = *pipeline;
      pppVVar1 = &(this->graphics_pipelines).
                  super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
    __position_00._M_current =
         (this->graphics_infos).
         super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->graphics_infos).
        super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<VkGraphicsPipelineCreateInfo_const*,std::allocator<VkGraphicsPipelineCreateInfo_const*>>
      ::_M_realloc_insert<VkGraphicsPipelineCreateInfo_const*const&>
                ((vector<VkGraphicsPipelineCreateInfo_const*,std::allocator<VkGraphicsPipelineCreateInfo_const*>>
                  *)&this->graphics_infos,__position_00,&local_38);
    }
    else {
      *__position_00._M_current = create_info;
      pppVVar2 = &(this->graphics_infos).
                  super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppVVar2 = *pppVVar2 + 1;
    }
    __position_01._M_current =
         (this->graphics_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_01._M_current ==
        (this->graphics_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->graphics_hashes,
                 __position_01,&local_30);
    }
    else {
      *__position_01._M_current = hash;
      (this->graphics_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position_01._M_current + 1;
    }
  }
  else {
    *pipeline = (VkPipeline)hash;
  }
  return true;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		if (!graphics_pipeline_is_active(hash))
		{
			*pipeline = fake_handle<VkPipeline>(hash);
			return true;
		}

		if (device)
		{
			if (device->has_pipeline_stats())
				const_cast<VkGraphicsPipelineCreateInfo *>(create_info)->flags |=
						VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR | VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR;

			LOGI("Creating graphics pipeline %0" PRIX64 "\n", hash);
			if (vkCreateGraphicsPipelines(device->get_device(), pipeline_cache, 1, create_info, nullptr, pipeline) !=
			    VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*pipeline = fake_handle<VkPipeline>(hash);

		graphics_pipelines.push_back(*pipeline);
		graphics_infos.push_back(create_info);
		graphics_hashes.push_back(hash);
		return true;
	}